

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbePmaReadVarint(PmaReader *p,u64 *pnOut)

{
  u8 uVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  u8 *p_00;
  uint uVar6;
  long in_FS_OFFSET;
  u8 *a;
  u8 aVarint [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->aMap == (u8 *)0x0) {
    lVar5 = p->iReadOff % (long)p->nBuffer;
    if (p->nBuffer - (int)lVar5 < 9 || lVar5 == 0) {
      uVar6 = 0;
      do {
        iVar4 = vdbePmaReadBlob(p,1,&a);
        if (iVar4 != 0) goto LAB_0015028f;
        uVar1 = *a;
        aVarint[uVar6 & 0xf] = uVar1;
        uVar6 = uVar6 + 1;
      } while ((char)uVar1 < '\0');
      sqlite3GetVarint(aVarint,pnOut);
      goto LAB_0015028d;
    }
    p_00 = p->aBuffer + lVar5;
  }
  else {
    p_00 = p->aMap + p->iReadOff;
  }
  bVar3 = sqlite3GetVarint(p_00,pnOut);
  p->iReadOff = p->iReadOff + (ulong)bVar3;
LAB_0015028d:
  iVar4 = 0;
LAB_0015028f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbePmaReadVarint(PmaReader *p, u64 *pnOut){
  int iBuf;

  if( p->aMap ){
    p->iReadOff += sqlite3GetVarint(&p->aMap[p->iReadOff], pnOut);
  }else{
    iBuf = p->iReadOff % p->nBuffer;
    if( iBuf && (p->nBuffer-iBuf)>=9 ){
      p->iReadOff += sqlite3GetVarint(&p->aBuffer[iBuf], pnOut);
    }else{
      u8 aVarint[16], *a;
      int i = 0, rc;
      do{
        rc = vdbePmaReadBlob(p, 1, &a);
        if( rc ) return rc;
        aVarint[(i++)&0xf] = a[0];
      }while( (a[0]&0x80)!=0 );
      sqlite3GetVarint(aVarint, pnOut);
    }
  }

  return SQLITE_OK;
}